

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

char * detect_proxy(connectdata *conn)

{
  int iVar1;
  char *local_b0;
  char *prox;
  char *envp;
  char *protop;
  char proxy_env [128];
  char *proxy;
  connectdata *conn_local;
  
  proxy_env[0x78] = '\0';
  proxy_env[0x79] = '\0';
  proxy_env[0x7a] = '\0';
  proxy_env[0x7b] = '\0';
  proxy_env[0x7c] = '\0';
  proxy_env[0x7d] = '\0';
  proxy_env[0x7e] = '\0';
  proxy_env[0x7f] = '\0';
  prox = (char *)&protop;
  envp = conn->handler->scheme;
  while (*envp != '\0') {
    iVar1 = tolower((int)*envp);
    *prox = (char)iVar1;
    prox = prox + 1;
    envp = envp + 1;
  }
  strcpy(prox,"_proxy");
  local_b0 = curl_getenv((char *)&protop);
  if ((local_b0 == (char *)0x0) &&
     (iVar1 = Curl_strcasecompare("http_proxy",(char *)&protop), iVar1 == 0)) {
    Curl_strntoupper((char *)&protop,(char *)&protop,0x80);
    local_b0 = curl_getenv((char *)&protop);
  }
  if (local_b0 == (char *)0x0) {
    proxy_env._120_8_ = curl_getenv("all_proxy");
    if ((char *)proxy_env._120_8_ == (char *)0x0) {
      proxy_env._120_8_ = curl_getenv("ALL_PROXY");
    }
  }
  else {
    proxy_env._120_8_ = local_b0;
  }
  return (char *)proxy_env._120_8_;
}

Assistant:

static char *detect_proxy(struct connectdata *conn)
{
  char *proxy = NULL;

  /* If proxy was not specified, we check for default proxy environment
   * variables, to enable i.e Lynx compliance:
   *
   * http_proxy=http://some.server.dom:port/
   * https_proxy=http://some.server.dom:port/
   * ftp_proxy=http://some.server.dom:port/
   * no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   * all_proxy=http://some.server.dom:port/
   *   (seems to exist for the CERN www lib. Probably
   *   the first to check for.)
   *
   * For compatibility, the all-uppercase versions of these variables are
   * checked if the lowercase versions don't exist.
   */
  char proxy_env[128];
  const char *protop = conn->handler->scheme;
  char *envp = proxy_env;
  char *prox;

  /* Now, build <protocol>_proxy and check for such a one to use */
  while(*protop)
    *envp++ = (char)tolower((int)*protop++);

  /* append _proxy */
  strcpy(envp, "_proxy");

  /* read the protocol proxy: */
  prox=curl_getenv(proxy_env);

  /*
   * We don't try the uppercase version of HTTP_PROXY because of
   * security reasons:
   *
   * When curl is used in a webserver application
   * environment (cgi or php), this environment variable can
   * be controlled by the web server user by setting the
   * http header 'Proxy:' to some value.
   *
   * This can cause 'internal' http/ftp requests to be
   * arbitrarily redirected by any external attacker.
   */
  if(!prox && !strcasecompare("http_proxy", proxy_env)) {
    /* There was no lowercase variable, try the uppercase version: */
    Curl_strntoupper(proxy_env, proxy_env, sizeof(proxy_env));
    prox=curl_getenv(proxy_env);
  }

  if(prox)
    proxy = prox; /* use this */
  else {
    proxy = curl_getenv("all_proxy"); /* default proxy to use */
    if(!proxy)
      proxy=curl_getenv("ALL_PROXY");
  }

  return proxy;
}